

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTFlightData.cpp
# Opt level: O2

bool __thiscall LTFlightData::CreateAircraft(LTFlightData *this,double simTime)

{
  dequePositionTy *this_00;
  recursive_mutex *__mutex;
  bool bVar1;
  size_type sVar2;
  reference ppVar3;
  LTAircraft *this_01;
  string sPosDeque;
  
  bVar1 = true;
  if (this->pAc == (LTAircraft *)0x0) {
    bVar1 = AcSlotAvailable(this);
    if (bVar1) {
      __mutex = &this->dataAccessMutex;
      std::recursive_mutex::lock(__mutex);
      bVar1 = CalcNextPos(this,simTime);
      if (bVar1) {
        this_00 = &this->posDeque;
        while ((sVar2 = std::deque<positionTy,_std::allocator<positionTy>_>::size(this_00),
               1 < sVar2 &&
               (ppVar3 = std::_Deque_iterator<positionTy,_positionTy_&,_positionTy_*>::operator[]
                                   (&(this->posDeque).
                                     super__Deque_base<positionTy,_std::allocator<positionTy>_>.
                                     _M_impl.super__Deque_impl_data._M_start,1),
               ppVar3->_ts <= simTime))) {
          std::deque<positionTy,_std::allocator<positionTy>_>::pop_front(this_00);
        }
        bVar1 = validForAcCreate(this,simTime);
        if (bVar1) {
          positionDeque2String_abi_cxx11_(&sPosDeque,this_00,(positionTy *)0x0);
          DetermineAcModel(this);
          if (((this->statData).acTypeIcao._M_string_length == 0) && ((int)dataRefs.iLogLevel < 3))
          {
            LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTFlightData.cpp"
                   ,0xab1,"CreateAircraft",logWARN,
                   "Tracking data for \'%s\' (man \'%s\', mdl \'%s\') lacks ICAO a/c type code, can\'t derive type -> will be rendered with standard a/c %s"
                   ,(this->acKey).key._M_dataplus._M_p,(this->statData).man._M_dataplus._M_p,
                   (this->statData).mdl._M_dataplus._M_p,
                   dataRefs.sDefaultAcIcaoType._M_dataplus._M_p);
          }
          this_01 = (LTAircraft *)operator_new(0x958);
          LTAircraft::LTAircraft(this_01,this);
          this->pAc = this_01;
          std::__cxx11::string::~string((string *)&sPosDeque);
          pthread_mutex_unlock((pthread_mutex_t *)__mutex);
          return true;
        }
      }
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool LTFlightData::CreateAircraft ( double simTime )
{
    // short-cut if exists already
    if ( hasAc() ) return true;
    
    // exit if too many a/c shown and this one wouldn't be one of the nearest ones
    if (!AcSlotAvailable())
        return false;
    
    try {
        // get the  mutex, not so much for protection,
        // but to speed up creation (which read-accesses lots of data and
        // thus makes many calls to the lock, which are now just quick recursive calls)
        std::lock_guard<std::recursive_mutex> lock (dataAccessMutex);
        
        // make sure positional data is up-to-date
        // (also does a last validation...and now with lock, so that state is secured)
        if ( !CalcNextPos(simTime) )
            return false;
        
        // This can have change data in the posDeque...let's see if we are still valid for a/c create
        // Remove outdated positions from posDeque, ie. all positions before simTime
        while (posDeque.size() >= 2 && posDeque[1].ts() <= simTime)
            posDeque.pop_front();
        if ( !validForAcCreate(simTime) )
            return false;
        
        // There are yet unsolved errors where the subsequent aircraft creation failes with an
        // empty posDeque, though we just - while holding the dataAccessMutex - have verified
        // that we are valid for creation. See Issue #174.
        // Next time we see that bug we want to know what NOW is in posDeque:
        const std::string sPosDeque = positionDeque2String(posDeque);
        
        // Make sure we have a valid a/c model now
        DetermineAcModel();
        if (statData.acTypeIcao.empty()) {          // we don't...
            LOG_MSG(logWARN,ERR_NO_AC_TYPE,
                    key().c_str(),
                    statData.man.c_str(), statData.mdl.c_str(),
                    dataRefs.GetDefaultAcIcaoType().c_str());
        }

        // create the object (constructor will recursively re-access the lock)
        try {
            pAc = new LTAircraft(*this);
        } catch (const std::exception& e) {
            LOG_MSG(logERR, ERR_EXCEPTION_AC_CREATE,
                    key().c_str(), statData.acTypeIcao.c_str(),
                    e.what(), sPosDeque.c_str());
            pAc = nullptr;
        }
        catch(...) {
            LOG_MSG(logERR, ERR_UNKN_EXCP_AC_CREATE,
                    key().c_str(), statData.acTypeIcao.c_str(),
                    "<?>", sPosDeque.c_str());
            pAc = nullptr;
        }
        if (!pAc)
        {
            LOG_MSG(logERR,ERR_NEW_OBJECT,key().c_str());
            return false;
        }
    } catch(const std::system_error& e) {
        LOG_MSG(logERR, ERR_LOCK_ERROR, key().c_str(), e.what());
    }
    // success
    return true;
}